

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  undefined4 uVar1;
  stbtt__point sVar2;
  stbtt__point sVar3;
  undefined4 uVar4;
  uint uVar5;
  void *p;
  stbtt__point *__ptr;
  stbtt__point *points;
  stbtt__edge *p_00;
  float *scanline;
  stbtt__active_edge *psVar6;
  stbtt__active_edge *psVar7;
  undefined8 *puVar8;
  stbtt__active_edge *psVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uchar uVar14;
  stbtt__edge *psVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  stbtt__edge *psVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  float *pfVar23;
  bool bVar24;
  undefined8 *puVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float bx0;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  undefined4 in_XMM4_Db;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float y0;
  stbtt__active_edge *active;
  float local_318;
  stbtt__active_edge *local_2f0;
  int local_2e4;
  float local_2a8;
  undefined1 local_290 [16];
  undefined8 *local_280;
  float *local_278;
  int local_270;
  float local_26c;
  undefined1 local_268 [16];
  ulong local_258;
  float *local_250;
  undefined1 local_248 [16];
  ulong local_238;
  int local_230;
  
  local_248._4_4_ = in_XMM4_Db;
  local_248._0_4_ = shift_y;
  local_248._8_4_ = in_XMM4_Dc;
  local_248._12_4_ = in_XMM4_Dd;
  local_268._4_4_ = in_XMM3_Db;
  local_268._0_4_ = shift_x;
  local_268._8_4_ = in_XMM3_Dc;
  local_268._12_4_ = in_XMM3_Dd;
  if (0 < num_verts) {
    fVar27 = scale_y;
    if (scale_x <= scale_y) {
      fVar27 = scale_x;
    }
    fVar27 = (flatness_in_pixels / fVar27) * (flatness_in_pixels / fVar27);
    lVar11 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + ((&vertices->type)[lVar11] == '\x01');
      lVar11 = lVar11 + 0xe;
    } while ((ulong)(uint)num_verts * 0xe != lVar11);
    if (uVar5 != 0) {
      uVar13 = (ulong)uVar5;
      __ptr = (stbtt__point *)malloc(uVar13 * 4);
      if (__ptr != (stbtt__point *)0x0) {
        scanline = (float *)&local_238;
        bVar10 = false;
        local_318 = 0.0;
        points = (stbtt__point *)0x0;
        fVar28 = 0.0;
        local_258 = (ulong)(uint)y_off;
        bVar26 = true;
        do {
          bVar24 = bVar26;
          if ((bVar10) &&
             (points = (stbtt__point *)malloc((long)(int)fVar28 << 3), points == (stbtt__point *)0x0
             )) goto LAB_0018c3e3;
          local_238 = local_238 & 0xffffffff00000000;
          fVar28 = 0.0;
          fVar29 = 0.0;
          uVar5 = 0xffffffff;
          lVar11 = 0;
          do {
            fVar30 = (float)local_238;
            switch((&vertices->type)[lVar11]) {
            case '\x01':
              if (-1 < (int)uVar5) {
                (&__ptr->x)[uVar5] = (float)((int)(float)local_238 - (int)local_318);
              }
              uVar5 = uVar5 + 1;
              auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar11));
              auVar32 = pshuflw(auVar32,auVar32,0x60);
              fVar28 = (float)(auVar32._0_4_ >> 0x10);
              fVar29 = (float)(auVar32._4_4_ >> 0x10);
              local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              if (points != (stbtt__point *)0x0) {
                points[(int)fVar30].x = fVar28;
                points[(int)fVar30].y = fVar29;
              }
              local_318 = fVar30;
              break;
            case '\x02':
              lVar21 = (long)(int)(float)local_238;
              auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar11));
              auVar32 = pshuflw(auVar32,auVar32,0x60);
              fVar28 = (float)(auVar32._0_4_ >> 0x10);
              fVar29 = (float)(auVar32._4_4_ >> 0x10);
              local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              if (points != (stbtt__point *)0x0) {
                points[lVar21].x = fVar28;
                points[lVar21].y = fVar29;
              }
              break;
            case '\x03':
              stbtt__tesselate_curve
                        (points,(int *)scanline,fVar28,fVar29,
                         (float)(int)*(short *)((long)&vertices->cx + lVar11),
                         (float)(int)*(short *)((long)&vertices->cy + lVar11),
                         (float)(int)*(short *)((long)&vertices->x + lVar11),
                         (float)(int)*(short *)((long)&vertices->y + lVar11),fVar27,0);
              goto LAB_0018b667;
            case '\x04':
              stbtt__tesselate_cubic
                        (points,(int *)scanline,fVar28,fVar29,
                         (float)(int)*(short *)((long)&vertices->cx + lVar11),
                         (float)(int)*(short *)((long)&vertices->cy + lVar11),
                         (float)(int)*(short *)((long)&vertices->cx1 + lVar11),
                         (float)(int)*(short *)((long)&vertices->cy1 + lVar11),
                         (float)(int)*(short *)((long)&vertices->x + lVar11),
                         (float)(int)*(short *)((long)&vertices->y + lVar11),fVar27,0);
LAB_0018b667:
              auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar11));
              auVar32 = pshuflw(auVar32,auVar32,0x60);
              fVar28 = (float)(auVar32._0_4_ >> 0x10);
              fVar29 = (float)(auVar32._4_4_ >> 0x10);
            }
            lVar11 = lVar11 + 0xe;
          } while ((ulong)(uint)num_verts * 0xe != lVar11);
          (&__ptr->x)[(int)uVar5] = (float)((int)(float)local_238 - (int)local_318);
          bVar10 = true;
          fVar28 = (float)local_238;
          bVar26 = false;
        } while (bVar24);
        if (points != (stbtt__point *)0x0) {
          uVar12 = 0;
          lVar11 = 0;
          do {
            lVar11 = (long)(int)lVar11 + (long)(int)(&__ptr->x)[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
          local_2a8 = scale_y;
          if (invert != 0) {
            local_2a8 = -scale_y;
          }
          p_00 = (stbtt__edge *)malloc(lVar11 * 0x14 + 0x14);
          if (p_00 != (stbtt__edge *)0x0) {
            uVar12 = 0;
            uVar5 = 0;
            iVar17 = 0;
            do {
              fVar27 = (&__ptr->x)[uVar12];
              if (0 < (long)(int)fVar27) {
                lVar11 = 0;
                iVar16 = (int)fVar27 + -1;
                do {
                  lVar21 = (long)iVar16;
                  fVar28 = points[iVar17 + lVar21].y;
                  fVar29 = points[iVar17 + lVar11].y;
                  iVar22 = (int)lVar11;
                  if ((fVar28 != fVar29) || (NAN(fVar28) || NAN(fVar29))) {
                    psVar15 = p_00 + (int)uVar5;
                    p_00[(int)uVar5].invert = 0;
                    iVar20 = iVar22;
                    if (invert == 0) {
                      if (fVar28 < fVar29) goto LAB_0018b7f1;
                    }
                    else if (fVar29 < fVar28) {
LAB_0018b7f1:
                      psVar15->invert = 1;
                      lVar21 = lVar11;
                      iVar20 = iVar16;
                    }
                    sVar2 = points[(long)iVar17 + (long)iVar20];
                    sVar3 = points[iVar17 + lVar21];
                    psVar15->x0 = sVar2.x * scale_x + (float)local_268._0_4_;
                    psVar15->y0 = sVar2.y * local_2a8 + (float)local_248._0_4_;
                    psVar15->x1 = sVar3.x * scale_x + (float)local_268._0_4_;
                    psVar15->y1 = sVar3.y * local_2a8 + (float)local_248._0_4_;
                    uVar5 = uVar5 + 1;
                  }
                  lVar11 = lVar11 + 1;
                  iVar16 = iVar22;
                } while ((int)fVar27 != lVar11);
              }
              iVar17 = (int)fVar27 + iVar17;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar13);
            stbtt__sort_edges_quicksort(p_00,uVar5);
            if (1 < (int)uVar5) {
              uVar13 = 1;
              lVar11 = 2;
              psVar15 = p_00;
              do {
                uVar1 = p_00[uVar13].x0;
                uVar4 = p_00[uVar13].y0;
                local_230 = p_00[uVar13].invert;
                local_238._0_4_ = p_00[uVar13].x1;
                local_238._4_4_ = p_00[uVar13].y1;
                lVar21 = lVar11;
                psVar19 = psVar15;
                do {
                  if (psVar19->y0 <= (float)uVar4) {
                    uVar18 = (int)lVar21 - 1;
                    goto LAB_0018b8d0;
                  }
                  psVar19[1].invert = psVar19->invert;
                  fVar27 = psVar19->y0;
                  fVar28 = psVar19->x1;
                  fVar29 = psVar19->y1;
                  psVar19[1].x0 = psVar19->x0;
                  psVar19[1].y0 = fVar27;
                  psVar19[1].x1 = fVar28;
                  psVar19[1].y1 = fVar29;
                  lVar21 = lVar21 + -1;
                  psVar19 = psVar19 + -1;
                } while (1 < lVar21);
                uVar18 = 0;
LAB_0018b8d0:
                if (uVar13 != uVar18) {
                  p_00[(int)uVar18].x0 = (float)uVar1;
                  p_00[(int)uVar18].y0 = (float)uVar4;
                  p_00[(int)uVar18].x1 = (float)local_238;
                  p_00[(int)uVar18].y1 = (float)local_238._4_4_;
                  p_00[(int)uVar18].invert = local_230;
                }
                uVar13 = uVar13 + 1;
                lVar11 = lVar11 + 1;
                psVar15 = psVar15 + 1;
              } while (uVar13 != uVar5);
            }
            local_290._0_8_ = (stbtt__active_edge *)0x0;
            uVar13 = (ulong)result->w;
            if (0x40 < (long)uVar13) {
              scanline = (float *)malloc((ulong)(uint)result->w * 8 + 4);
            }
            iVar17 = result->h;
            p_00[(int)uVar5].y0 = (float)(iVar17 + (int)local_258) + 1.0;
            if (0 < iVar17) {
              local_26c = (float)x_off;
              local_278 = scanline + uVar13;
              local_250 = local_278 + 1;
              uVar12 = local_258 & 0xffffffff;
              local_2e4 = 0;
              local_280 = (undefined8 *)0x0;
              local_290._12_4_ = 0.0;
              local_2f0 = (stbtt__active_edge *)0x0;
              psVar15 = p_00;
              psVar9 = (stbtt__active_edge *)0x0;
              do {
                local_270 = (int)uVar12;
                fVar27 = (float)local_270;
                fVar28 = fVar27 + 1.0;
                iVar17 = (int)uVar13;
                memset(scanline,0,(long)iVar17 * 4);
                pfVar23 = local_278;
                memset(local_278,0,(long)iVar17 * 4 + 4);
                if (psVar9 != (stbtt__active_edge *)0x0) {
                  psVar6 = (stbtt__active_edge *)local_290;
                  do {
                    psVar7 = psVar9;
                    if (psVar9->ey <= fVar27) {
                      psVar6->next = psVar9->next;
                      if ((psVar9->direction == 0.0) && (!NAN(psVar9->direction))) {
                        __assert_fail("z->direction",
                                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                      ,0xd03,
                                      "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                     );
                      }
                      psVar9->direction = 0.0;
                      psVar9->next = local_2f0;
                      psVar7 = psVar6;
                      local_2f0 = psVar9;
                    }
                    psVar9 = psVar7->next;
                    psVar6 = psVar7;
                  } while (psVar9 != (stbtt__active_edge *)0x0);
                }
                fVar29 = psVar15->y0;
                puVar25 = local_280;
                if (fVar29 <= fVar28) {
                  bVar26 = (int)local_258 != 0;
                  psVar9 = local_2f0;
                  do {
                    fVar30 = psVar15->y1;
                    if ((fVar29 != fVar30) || (local_2f0 = psVar9, NAN(fVar29) || NAN(fVar30))) {
                      puVar8 = puVar25;
                      if (psVar9 == (stbtt__active_edge *)0x0) {
                        if ((float)local_290._12_4_ == 0.0) {
                          puVar8 = (undefined8 *)malloc(0x6408);
                          if (puVar8 == (undefined8 *)0x0) {
                            __assert_fail("z != ((void*)0)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                          ,0xb2d,
                                          "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                         );
                          }
                          *puVar8 = puVar25;
                          local_290._12_4_ = 1.11964e-42;
                        }
                        else {
                          local_290._12_4_ = local_290._12_4_ + -1;
                        }
                        psVar9 = (stbtt__active_edge *)
                                 (puVar8 + (long)(int)local_290._12_4_ * 4 + 1);
                        local_2f0 = (stbtt__active_edge *)0x0;
                      }
                      else {
                        local_2f0 = psVar9->next;
                      }
                      fVar33 = psVar15->x0;
                      fVar35 = (psVar15->x1 - fVar33) / (fVar30 - fVar29);
                      psVar9->fdx = fVar35;
                      psVar9->fdy = (float)(-(uint)(fVar35 != 0.0) & (uint)(1.0 / fVar35));
                      psVar9->fx = ((fVar27 - fVar29) * fVar35 + fVar33) - local_26c;
                      psVar9->direction =
                           *(float *)(&DAT_0026ee20 + (ulong)(psVar15->invert == 0) * 4);
                      psVar9->sy = fVar29;
                      psVar9->ey = fVar30;
                      psVar9->next = (stbtt__active_edge *)0x0;
                      if (fVar30 < fVar27 && (local_2e4 == 0 && bVar26)) {
                        psVar9->ey = fVar27;
                        fVar30 = fVar27;
                      }
                      if (fVar30 < fVar27) {
                        __assert_fail("z->ey >= scan_y_top",
                                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                      ,0xd16,
                                      "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                     );
                      }
                      psVar9->next = (stbtt__active_edge *)local_290._0_8_;
                      local_290._0_8_ = psVar9;
                      puVar25 = puVar8;
                    }
                    fVar29 = psVar15[1].y0;
                    psVar15 = psVar15 + 1;
                    psVar9 = local_2f0;
                  } while (fVar29 <= fVar28);
                }
                local_280 = puVar25;
                if ((stbtt__active_edge *)local_290._0_8_ != (stbtt__active_edge *)0x0) {
                  fVar29 = (float)iVar17;
                  psVar9 = (stbtt__active_edge *)local_290._0_8_;
                  do {
                    fVar30 = psVar9->ey;
                    if (fVar30 < fVar27) {
                      __assert_fail("e->ey >= y_top",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc12,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar33 = psVar9->fx;
                    fVar35 = psVar9->fdx;
                    if ((fVar35 != 0.0) || (NAN(fVar35))) {
                      fVar39 = psVar9->sy;
                      if (fVar28 < fVar39) {
                        __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                      ,0xc25,
                                      "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                     );
                      }
                      fVar37 = fVar35 + fVar33;
                      fVar34 = (float)(~-(uint)(fVar27 < fVar39) & (uint)fVar33 |
                                      (uint)((fVar39 - fVar27) * fVar35 + fVar33) &
                                      -(uint)(fVar27 < fVar39));
                      if ((((fVar34 < 0.0) ||
                           (fVar36 = (float)(~-(uint)(fVar30 < fVar28) & (uint)fVar37 |
                                            (uint)((fVar30 - fVar27) * fVar35 + fVar33) &
                                            -(uint)(fVar30 < fVar28)), fVar36 < 0.0)) ||
                          (fVar29 <= fVar34)) || (fVar29 <= fVar36)) {
                        if (0 < iVar17) {
                          local_248 = ZEXT416((uint)fVar35);
                          local_268 = ZEXT416((uint)fVar33);
                          iVar16 = 0;
                          do {
                            fVar39 = (float)iVar16;
                            iVar22 = iVar16 + 1;
                            fVar34 = (float)iVar22;
                            fVar30 = (fVar39 - fVar33) / fVar35 + fVar27;
                            fVar35 = (fVar34 - fVar33) / fVar35 + fVar27;
                            if ((fVar39 <= fVar33) || (fVar37 <= fVar34)) {
                              if ((fVar39 <= fVar37) || (fVar33 <= fVar34)) {
                                fVar36 = fVar27;
                                if (((fVar39 <= fVar33) || (fVar37 <= fVar39)) &&
                                   ((fVar39 <= fVar37 || (fVar33 <= fVar39)))) {
                                  fVar30 = fVar27;
                                  if (((fVar33 < fVar34) && (fVar34 < fVar37)) ||
                                     ((fVar39 = fVar33, fVar37 < fVar34 && (fVar34 < fVar33))))
                                  goto LAB_0018bedc;
                                  goto LAB_0018bfa1;
                                }
                              }
                              else {
                                stbtt__handle_clipped_edge
                                          (scanline,iVar16,psVar9,fVar33,fVar27,fVar34,fVar35);
                                fVar33 = fVar34;
                                fVar36 = fVar35;
                              }
                              stbtt__handle_clipped_edge
                                        (scanline,iVar16,psVar9,fVar33,fVar36,fVar39,fVar30);
                            }
                            else {
                              stbtt__handle_clipped_edge
                                        (scanline,iVar16,psVar9,fVar33,fVar27,fVar39,fVar30);
                              fVar33 = fVar39;
LAB_0018bedc:
                              stbtt__handle_clipped_edge
                                        (scanline,iVar16,psVar9,fVar33,fVar30,fVar34,fVar35);
                              fVar39 = fVar34;
                              fVar30 = fVar35;
                            }
LAB_0018bfa1:
                            stbtt__handle_clipped_edge
                                      (scanline,iVar16,psVar9,fVar39,fVar30,fVar37,fVar28);
                            fVar33 = (float)local_268._0_4_;
                            fVar35 = (float)local_248._0_4_;
                            iVar16 = iVar22;
                          } while (iVar17 != iVar22);
                        }
                      }
                      else {
                        if (fVar39 <= fVar27) {
                          fVar39 = fVar27;
                        }
                        uVar5 = (uint)fVar34;
                        if (fVar28 <= fVar30) {
                          fVar30 = fVar28;
                        }
                        if (uVar5 == (int)fVar36) {
                          if (((int)uVar5 < 0) || (iVar17 <= (int)uVar5)) {
                            __assert_fail("x >= 0 && x < len",
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                          ,0xc41,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          fVar38 = (fVar30 - fVar39) * psVar9->direction;
                          fVar30 = stbtt__position_trapezoid_area
                                             (fVar38,fVar34,(float)(int)uVar5 + 1.0,fVar36,
                                              (float)(int)uVar5 + 1.0);
                          uVar13 = (ulong)uVar5;
                          scanline[uVar13] = fVar30 + scanline[uVar13];
                        }
                        else {
                          fVar31 = psVar9->fdy;
                          bx0 = fVar36;
                          if (fVar36 < fVar34) {
                            fVar38 = fVar27 - fVar39;
                            fVar39 = (fVar27 - fVar30) + fVar28;
                            fVar35 = -fVar35;
                            fVar31 = -fVar31;
                            bx0 = fVar34;
                            fVar33 = fVar37;
                            fVar30 = fVar38 + fVar28;
                            fVar34 = fVar36;
                          }
                          if (fVar31 < 0.0) {
                            __assert_fail("dy >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                          ,0xc53,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          if (fVar35 < 0.0) {
                            __assert_fail("dx >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                          ,0xc54,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          iVar22 = (int)bx0;
                          iVar16 = (int)fVar34 + 1;
                          fVar36 = ((float)iVar16 - fVar33) * fVar31 + fVar27;
                          fVar37 = (float)(int)bx0;
                          fVar35 = fVar28;
                          if (fVar36 <= fVar28) {
                            fVar35 = fVar36;
                          }
                          fVar38 = psVar9->direction;
                          fVar36 = (fVar35 - fVar39) * fVar38;
                          lVar11 = (long)(int)fVar34;
                          fVar33 = (fVar37 - fVar33) * fVar31 + fVar27;
                          scanline[lVar11] =
                               ((float)iVar16 - fVar34) * fVar36 * 0.5 + scanline[lVar11];
                          if (iVar22 - iVar16 != 0 && iVar16 <= iVar22) {
                            fVar35 = (float)(~-(uint)(fVar28 < fVar33) & (uint)fVar31 |
                                            (uint)((fVar28 - fVar35) / (float)(iVar22 - iVar16)) &
                                            -(uint)(fVar28 < fVar33)) * fVar38;
                            do {
                              scanline[lVar11 + 1] = fVar35 * 0.5 + fVar36 + scanline[lVar11 + 1];
                              fVar36 = fVar36 + fVar35;
                              lVar11 = lVar11 + 1;
                            } while (iVar22 + -1 != (int)lVar11);
                          }
                          if (1.01 < ABS(fVar36)) {
                            __assert_fail("fabs(area) <= 1.01f",
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                          ,0xc94,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          fVar35 = fVar28;
                          if (fVar33 <= fVar28) {
                            fVar35 = fVar33;
                          }
                          if (fVar30 <= fVar35 + -0.01) {
                            __assert_fail("sy1 > y_final-0.01f",
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                          ,0xc95,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          fVar33 = stbtt__position_trapezoid_area
                                             (fVar30 - fVar35,fVar37,fVar37 + 1.0,bx0,fVar37 + 1.0);
                          uVar13 = (ulong)iVar22;
                          scanline[uVar13] = fVar33 * fVar38 + fVar36 + scanline[uVar13];
                          fVar38 = (fVar30 - fVar39) * fVar38;
                        }
                        local_250[uVar13] = fVar38 + local_250[uVar13];
                      }
                    }
                    else if (fVar33 < fVar29) {
                      if (0.0 <= fVar33) {
                        local_268 = ZEXT416((uint)fVar33);
                        stbtt__handle_clipped_edge
                                  (scanline,(int)fVar33,psVar9,fVar33,fVar27,fVar33,fVar28);
                        iVar16 = (int)fVar33 + 1;
                        fVar33 = (float)local_268._0_4_;
                      }
                      else {
                        iVar16 = 0;
                      }
                      stbtt__handle_clipped_edge
                                (local_278,iVar16,psVar9,fVar33,fVar27,fVar33,fVar28);
                    }
                    psVar9 = psVar9->next;
                  } while (psVar9 != (stbtt__active_edge *)0x0);
                  uVar13 = (ulong)(uint)result->w;
                  pfVar23 = local_278;
                }
                psVar9 = (stbtt__active_edge *)local_290._0_8_;
                if (0 < (int)uVar13) {
                  fVar27 = 0.0;
                  lVar11 = 0;
                  do {
                    fVar27 = fVar27 + pfVar23[lVar11];
                    iVar17 = (int)(ABS(scanline[lVar11] + fVar27) * 255.0 + 0.5);
                    uVar14 = (uchar)iVar17;
                    if (0xfe < iVar17) {
                      uVar14 = 0xff;
                    }
                    result->pixels[lVar11 + (long)result->stride * (long)local_2e4] = uVar14;
                    lVar11 = lVar11 + 1;
                    uVar13 = (ulong)result->w;
                  } while (lVar11 < (long)uVar13);
                }
                for (; psVar9 != (stbtt__active_edge *)0x0; psVar9 = psVar9->next) {
                  psVar9->fx = psVar9->fdx + psVar9->fx;
                }
                uVar12 = (ulong)(local_270 + 1);
                local_2e4 = local_2e4 + 1;
                psVar9 = (stbtt__active_edge *)local_290._0_8_;
                puVar25 = local_280;
              } while (local_2e4 < result->h);
              while (puVar25 != (undefined8 *)0x0) {
                puVar8 = (undefined8 *)*puVar25;
                free(puVar25);
                puVar25 = puVar8;
              }
            }
            if (scanline != (float *)&local_238) {
              free(scanline);
            }
            free(p_00);
          }
          free(__ptr);
          __ptr = points;
LAB_0018c3e3:
          free(__ptr);
        }
      }
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}